

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::appendFace(btSoftBody *this,int node0,int node1,int node2,Material *mat)

{
  Node *pNVar1;
  Face *pFVar2;
  Node *pNVar3;
  Node *pNVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (((node2 != node0) && (node0 != node1)) && (node1 != node2)) {
    appendFace(this,-1,mat);
    lVar5 = (long)(this->m_faces).m_size;
    pNVar1 = (this->m_nodes).m_data;
    pFVar2 = (this->m_faces).m_data;
    pFVar2[lVar5 + -1].m_n[0] = pNVar1 + node0;
    pNVar3 = (this->m_nodes).m_data;
    pFVar2[lVar5 + -1].m_n[1] = pNVar3 + node1;
    pNVar4 = (this->m_nodes).m_data;
    pFVar2[lVar5 + -1].m_n[2] = pNVar4 + node2;
    fVar12 = pNVar1[node0].m_x.m_floats[0];
    fVar8 = pNVar1[node0].m_x.m_floats[1];
    fVar6 = pNVar3[node1].m_x.m_floats[0] - fVar12;
    fVar9 = pNVar3[node1].m_x.m_floats[1] - fVar8;
    fVar11 = pNVar1[node0].m_x.m_floats[2];
    fVar7 = pNVar3[node1].m_x.m_floats[2] - fVar11;
    fVar12 = pNVar4[node2].m_x.m_floats[0] - fVar12;
    fVar8 = pNVar4[node2].m_x.m_floats[1] - fVar8;
    fVar11 = pNVar4[node2].m_x.m_floats[2] - fVar11;
    fVar10 = fVar9 * fVar11 - fVar8 * fVar7;
    fVar11 = fVar7 * fVar12 - fVar11 * fVar6;
    fVar12 = fVar8 * fVar6 - fVar12 * fVar9;
    pFVar2[lVar5 + -1].m_ra = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
    this->m_bUpdateRtCst = true;
  }
  return;
}

Assistant:

void			btSoftBody::appendFace(int node0,int node1,int node2,Material* mat)
{
	if (node0==node1)
		return;
	if (node1==node2)
		return;
	if (node2==node0)
		return;

	appendFace(-1,mat);
	Face&	f=m_faces[m_faces.size()-1];
	btAssert(node0!=node1);
	btAssert(node1!=node2);
	btAssert(node2!=node0);
	f.m_n[0]	=	&m_nodes[node0];
	f.m_n[1]	=	&m_nodes[node1];
	f.m_n[2]	=	&m_nodes[node2];
	f.m_ra		=	AreaOf(	f.m_n[0]->m_x,
		f.m_n[1]->m_x,
		f.m_n[2]->m_x);	
	m_bUpdateRtCst=true;
}